

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O2

bool __thiscall pbrt::BSDF::HasReflection(BSDF *this)

{
  BxDFFlags BVar1;
  
  BVar1 = TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
          ::Dispatch<pbrt::BxDFHandle::Flags()const::_lambda(auto:1)_1_>();
  return (bool)((byte)BVar1 & 1);
}

Assistant:

PBRT_CPU_GPU
    bool HasReflection() const { return (bxdf.Flags() & BxDFFlags::Reflection); }